

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O0

int ssl_parse_certificate_verify(mbedtls_ssl_context *ssl)

{
  int iVar1;
  size_t sVar2;
  size_t sig_len_00;
  size_t local_98;
  size_t dummy_hlen;
  mbedtls_pk_context *peer_pk;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t pk_alg;
  size_t hashlen;
  uchar *hash_start;
  uchar hash [48];
  size_t sig_len;
  size_t i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  hashlen = (size_t)&hash_start;
  peer_pk = (mbedtls_pk_context *)ssl->handshake->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
             ,0xff4,"=> parse certificate verify");
  iVar1 = mbedtls_ssl_ciphersuite_cert_req_allowed((mbedtls_ssl_ciphersuite_t *)peer_pk);
  if (iVar1 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xff7,"<= skip parse certificate verify");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xffe,"<= skip parse certificate verify");
    ssl->state = ssl->state + 1;
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = mbedtls_ssl_read_record(ssl,0);
    if (ssl_local._4_4_ == 0) {
      ssl->state = ssl->state + 1;
      if ((ssl->in_msgtype == 0x16) && (*ssl->in_msg == '\x0f')) {
        sVar2 = mbedtls_ssl_hs_hdr_len(ssl);
        if (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
          ssl_local._4_4_ = -0x6c00;
        }
        else {
          dummy_hlen = (size_t)&ssl->session_negotiate->peer_cert->pk;
          if (ssl->in_hslen < sVar2 + 2) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x102d,"bad certificate verify message");
            ssl_local._4_4_ = -0x7300;
          }
          else {
            ciphersuite_info._0_4_ = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[sVar2]);
            if (((mbedtls_md_type_t)ciphersuite_info != MBEDTLS_MD_NONE) &&
               (iVar1 = mbedtls_ssl_set_calc_verify_md(ssl,(uint)ssl->in_msg[sVar2]), iVar1 == 0)) {
              if ((mbedtls_md_type_t)ciphersuite_info == MBEDTLS_MD_SHA1) {
                hashlen = hashlen + 0x10;
              }
              _md_alg = 0;
              ciphersuite_info._4_4_ = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[sVar2 + 1]);
              if (ciphersuite_info._4_4_ == MBEDTLS_PK_NONE) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x104d,"peer not adhering to requested sig_alg for verify message");
                return -0x6600;
              }
              iVar1 = mbedtls_pk_can_do((mbedtls_pk_context *)dummy_hlen,ciphersuite_info._4_4_);
              if (iVar1 == 0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x1055,"sig_alg doesn\'t match cert key");
                return -0x6600;
              }
              if (ssl->in_hslen < sVar2 + 4) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x105c,"bad certificate verify message");
                return -0x7300;
              }
              sig_len_00 = (size_t)(int)(uint)CONCAT11(ssl->in_msg[sVar2 + 2],ssl->in_msg[sVar2 + 3]
                                                      );
              if (sVar2 + 4 + sig_len_00 != ssl->in_hslen) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x1064,"bad certificate verify message");
                return -0x7300;
              }
              iVar1 = (*ssl->handshake->calc_verify)(ssl,(uchar *)&hash_start,&local_98);
              if (iVar1 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x106d,"calc_verify",iVar1);
                return iVar1;
              }
              iVar1 = mbedtls_pk_verify((mbedtls_pk_context *)dummy_hlen,
                                        (mbedtls_md_type_t)ciphersuite_info,(uchar *)hashlen,_md_alg
                                        ,ssl->in_msg + sVar2 + 4,sig_len_00);
              if (iVar1 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x1075,"mbedtls_pk_verify",iVar1);
                return iVar1;
              }
              iVar1 = mbedtls_ssl_update_handshake_status(ssl);
              if (iVar1 != 0) {
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                           ,0x107b,"mbedtls_ssl_update_handshake_status",iVar1);
                return iVar1;
              }
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                         ,0x107f,"<= parse certificate verify");
              return 0;
            }
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x1038,"peer not adhering to requested sig_alg for verify message");
            ssl_local._4_4_ = -0x6600;
          }
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x1016,"bad certificate verify message");
        ssl_local._4_4_ = -0x7700;
      }
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x100d,"mbedtls_ssl_read_record",ssl_local._4_4_);
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_certificate_verify(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, sig_len;
    unsigned char hash[48];
    unsigned char *hash_start = hash;
    size_t hashlen;
    mbedtls_pk_type_t pk_alg;
    mbedtls_md_type_t md_alg;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
        ssl->handshake->ciphersuite_info;
    mbedtls_pk_context *peer_pk;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> parse certificate verify"));

    if (!mbedtls_ssl_ciphersuite_cert_req_allowed(ciphersuite_info)) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip parse certificate verify"));
        ssl->state++;
        return 0;
    }

#if defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
    if (ssl->session_negotiate->peer_cert == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip parse certificate verify"));
        ssl->state++;
        return 0;
    }
#else /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
    if (ssl->session_negotiate->peer_cert_digest == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip parse certificate verify"));
        ssl->state++;
        return 0;
    }
#endif /* !MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */

    /* Read the message without adding it to the checksum */
    ret = mbedtls_ssl_read_record(ssl, 0 /* no checksum update */);
    if (0 != ret) {
        MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_read_record"), ret);
        return ret;
    }

    ssl->state++;

    /* Process the message contents */
    if (ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE ||
        ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE_VERIFY) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate verify message"));
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }

    i = mbedtls_ssl_hs_hdr_len(ssl);

#if !defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
    peer_pk = &ssl->handshake->peer_pubkey;
#else /* !MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
    if (ssl->session_negotiate->peer_cert == NULL) {
        /* Should never happen */
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }
    peer_pk = &ssl->session_negotiate->peer_cert->pk;
#endif /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */

    /*
     *  struct {
     *     SignatureAndHashAlgorithm algorithm; -- TLS 1.2 only
     *     opaque signature<0..2^16-1>;
     *  } DigitallySigned;
     */
    if (i + 2 > ssl->in_hslen) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate verify message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    /*
     * Hash
     */
    md_alg = mbedtls_ssl_md_alg_from_hash(ssl->in_msg[i]);

    if (md_alg == MBEDTLS_MD_NONE || mbedtls_ssl_set_calc_verify_md(ssl, ssl->in_msg[i])) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("peer not adhering to requested sig_alg"
                                  " for verify message"));
        return MBEDTLS_ERR_SSL_ILLEGAL_PARAMETER;
    }

#if !defined(MBEDTLS_MD_SHA1)
    if (MBEDTLS_MD_SHA1 == md_alg) {
        hash_start += 16;
    }
#endif

    /* Info from md_alg will be used instead */
    hashlen = 0;

    i++;

    /*
     * Signature
     */
    if ((pk_alg = mbedtls_ssl_pk_alg_from_sig(ssl->in_msg[i]))
        == MBEDTLS_PK_NONE) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("peer not adhering to requested sig_alg"
                                  " for verify message"));
        return MBEDTLS_ERR_SSL_ILLEGAL_PARAMETER;
    }

    /*
     * Check the certificate's key type matches the signature alg
     */
    if (!mbedtls_pk_can_do(peer_pk, pk_alg)) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("sig_alg doesn't match cert key"));
        return MBEDTLS_ERR_SSL_ILLEGAL_PARAMETER;
    }

    i++;

    if (i + 2 > ssl->in_hslen) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate verify message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    sig_len = (ssl->in_msg[i] << 8) | ssl->in_msg[i+1];
    i += 2;

    if (i + sig_len != ssl->in_hslen) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate verify message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    /* Calculate hash and verify signature */
    {
        size_t dummy_hlen;
        ret = ssl->handshake->calc_verify(ssl, hash, &dummy_hlen);
        if (0 != ret) {
            MBEDTLS_SSL_DEBUG_RET(1, ("calc_verify"), ret);
            return ret;
        }
    }

    if ((ret = mbedtls_pk_verify(peer_pk,
                                 md_alg, hash_start, hashlen,
                                 ssl->in_msg + i, sig_len)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_pk_verify", ret);
        return ret;
    }

    ret = mbedtls_ssl_update_handshake_status(ssl);
    if (0 != ret) {
        MBEDTLS_SSL_DEBUG_RET(1, ("mbedtls_ssl_update_handshake_status"), ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= parse certificate verify"));

    return ret;
}